

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O3

int ConnectRoboteq(ROBOTEQ *pRoboteq,char *szCfgFilePath)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  FILE *__stream;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  char line [256];
  char response [256];
  byte local_338;
  char local_337;
  int *local_238;
  int *local_230;
  int *local_228;
  int *local_220;
  int *local_218;
  int *local_210;
  int *local_208;
  int *local_200;
  int *local_1f8;
  int *local_1f0;
  int *local_1e8;
  int *local_1e0;
  int *local_1d8;
  BOOL *local_1d0;
  BOOL *local_1c8;
  double *local_1c0;
  double *local_1b8;
  int *local_1b0;
  int *local_1a8;
  int *local_1a0;
  int *local_198;
  int *local_190;
  double *local_188;
  double *local_180;
  double *local_178;
  double *local_170;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  char local_138 [264];
  
  memset(pRoboteq->szCfgFilePath,0,0x100);
  sprintf(pRoboteq->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar5 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar5 != 0) {
    memset(&local_338,0,0x100);
    memset(pRoboteq->szDevPath + 5,0,0xfb);
    builtin_strncpy(pRoboteq->szDevPath,"COM1",5);
    local_1e8 = &pRoboteq->BaudRate;
    local_1e0 = &pRoboteq->timeout;
    local_1d8 = &pRoboteq->threadperiod;
    local_1d0 = &pRoboteq->bSaveRawData;
    pRoboteq->BaudRate = 0x2580;
    pRoboteq->timeout = 1000;
    pRoboteq->threadperiod = 100;
    pRoboteq->bSaveRawData = 1;
    local_1c8 = &pRoboteq->bEcho;
    pRoboteq->bEcho = 1;
    local_190 = pRoboteq->MinPWs;
    local_198 = pRoboteq->MidPWs;
    local_1a0 = pRoboteq->MaxPWs;
    local_1a8 = pRoboteq->InitPWs;
    local_1b0 = pRoboteq->ThresholdPWs;
    local_1b8 = pRoboteq->CoefPWs;
    lVar6 = -0xc;
    do {
      *(undefined4 *)((long)pRoboteq->MidPWs + lVar6) = 1000;
      *(undefined4 *)((long)pRoboteq->MaxPWs + lVar6) = 0x5dc;
      *(undefined4 *)((long)pRoboteq->InitPWs + lVar6) = 2000;
      *(undefined4 *)((long)pRoboteq->ThresholdPWs + lVar6) = 0x5dc;
      *(undefined4 *)((long)pRoboteq->CoefPWs + lVar6 + -4) = 0;
      *(undefined8 *)((long)pRoboteq->bProportionalPWs + lVar6 * 2) = 0x3ff0000000000000;
      *(undefined4 *)((long)pRoboteq->analoginputoffset + lVar6 + -4) = 1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0);
    local_140 = pRoboteq->analoginputoffset;
    local_148 = pRoboteq->analoginputthreshold;
    local_150 = pRoboteq->analoginputcoef;
    local_158 = pRoboteq->analoginputx;
    local_160 = pRoboteq->analoginputy;
    local_168 = pRoboteq->analoginputz;
    local_170 = pRoboteq->analoginputphi;
    local_178 = pRoboteq->analoginputtheta;
    local_180 = pRoboteq->analoginputpsi;
    local_188 = pRoboteq->analoginputmin;
    pRoboteq->analoginputthreshold[6] = 0.0;
    pRoboteq->analoginputthreshold[7] = 0.0;
    pRoboteq->analoginputthreshold[4] = 0.0;
    pRoboteq->analoginputthreshold[5] = 0.0;
    pRoboteq->analoginputthreshold[2] = 0.0;
    pRoboteq->analoginputthreshold[3] = 0.0;
    pRoboteq->analoginputthreshold[0] = 0.0;
    pRoboteq->analoginputthreshold[1] = 0.0;
    pRoboteq->analoginputoffset[6] = 0.0;
    pRoboteq->analoginputoffset[7] = 0.0;
    pRoboteq->analoginputoffset[4] = 0.0;
    pRoboteq->analoginputoffset[5] = 0.0;
    pRoboteq->analoginputoffset[2] = 0.0;
    pRoboteq->analoginputoffset[3] = 0.0;
    pRoboteq->analoginputoffset[0] = 0.0;
    pRoboteq->analoginputoffset[1] = 0.0;
    lVar6 = -8;
    do {
      pRoboteq->analoginputx[lVar6] = 1.0;
      (pRoboteq->analoginputx + lVar6)[1] = 1.0;
      (pRoboteq->analoginputy + lVar6)[0] = 0.0;
      (pRoboteq->analoginputy + lVar6)[1] = 0.0;
      (pRoboteq->analoginputz + lVar6)[0] = 0.0;
      (pRoboteq->analoginputz + lVar6)[1] = 0.0;
      (pRoboteq->analoginputphi + lVar6)[0] = 0.0;
      (pRoboteq->analoginputphi + lVar6)[1] = 0.0;
      (pRoboteq->analoginputtheta + lVar6)[0] = 0.0;
      (pRoboteq->analoginputtheta + lVar6)[1] = 0.0;
      (pRoboteq->analoginputpsi + lVar6)[0] = 0.0;
      (pRoboteq->analoginputpsi + lVar6)[1] = 0.0;
      (pRoboteq->analoginputmin + lVar6)[0] = 0.0;
      (pRoboteq->analoginputmin + lVar6)[1] = 0.0;
      pdVar1 = pRoboteq->analoginputmax + lVar6;
      pdVar1[0] = 0.0;
      pdVar1[1] = 0.0;
      (pRoboteq->analoginputmax + lVar6 + 8)[0] = 0.0;
      (pRoboteq->analoginputmax + lVar6 + 8)[1] = 0.0;
      lVar6 = lVar6 + 2;
    } while (lVar6 != 0);
    pRoboteq->rudderchan = 2;
    pRoboteq->rightthrusterchan = 1;
    pRoboteq->leftthrusterchan = 0;
    pRoboteq->vbat1analoginputchan = -1;
    pRoboteq->ibat1analoginputchan = -1;
    pRoboteq->vbat2analoginputchan = -1;
    pRoboteq->ibat2analoginputchan = -1;
    pRoboteq->ibat2analoginputchan = -1;
    pRoboteq->vbat3analoginputchan = -1;
    pRoboteq->ibat3analoginputchan = -1;
    pRoboteq->switchanaloginputchan = -1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar7 = "Configuration file not found.";
    }
    else {
      local_238 = &pRoboteq->rudderchan;
      local_230 = &pRoboteq->rightthrusterchan;
      local_228 = &pRoboteq->leftthrusterchan;
      local_220 = &pRoboteq->vbat1analoginputchan;
      local_218 = &pRoboteq->ibat1analoginputchan;
      local_210 = &pRoboteq->vbat2analoginputchan;
      local_208 = &pRoboteq->ibat2analoginputchan;
      local_200 = &pRoboteq->vbat3analoginputchan;
      local_1f8 = &pRoboteq->ibat3analoginputchan;
      local_1f0 = &pRoboteq->switchanaloginputchan;
      local_1c0 = pRoboteq->analoginputmax;
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ab8b6;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ab8ce;
        }
        if (local_338 != 0x23) break;
LAB_001ab8b6:
        if (pcVar7 == (char *)0x0) goto LAB_001ab8d3;
      }
      if (local_338 == 0x24) goto LAB_001ab8d3;
LAB_001ab8ce:
      if (pcVar7 == (char *)0x0) {
LAB_001ab8d3:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%255s",pRoboteq->szDevPath);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ab942;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ab94e;
        }
        if (local_338 != 0x23) break;
LAB_001ab942:
        if (pcVar7 == (char *)0x0) goto LAB_001ab953;
      }
      if (local_338 == 0x24) goto LAB_001ab953;
LAB_001ab94e:
      if (pcVar7 == (char *)0x0) {
LAB_001ab953:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_1e8);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ab9c7;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ab9d3;
        }
        if (local_338 != 0x23) break;
LAB_001ab9c7:
        if (pcVar7 == (char *)0x0) goto LAB_001ab9d8;
      }
      if (local_338 == 0x24) goto LAB_001ab9d8;
LAB_001ab9d3:
      if (pcVar7 == (char *)0x0) {
LAB_001ab9d8:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_1e0);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001aba4c;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001aba58;
        }
        if (local_338 != 0x23) break;
LAB_001aba4c:
        if (pcVar7 == (char *)0x0) goto LAB_001aba5d;
      }
      if (local_338 == 0x24) goto LAB_001aba5d;
LAB_001aba58:
      if (pcVar7 == (char *)0x0) {
LAB_001aba5d:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_1d8);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001abad1;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001abadd;
        }
        if (local_338 != 0x23) break;
LAB_001abad1:
        if (pcVar7 == (char *)0x0) goto LAB_001abae2;
      }
      if (local_338 == 0x24) goto LAB_001abae2;
LAB_001abadd:
      if (pcVar7 == (char *)0x0) {
LAB_001abae2:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_1d0);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001abb56;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001abb62;
        }
        if (local_338 != 0x23) break;
LAB_001abb56:
        if (pcVar7 == (char *)0x0) goto LAB_001abb67;
      }
      if (local_338 == 0x24) goto LAB_001abb67;
LAB_001abb62:
      if (pcVar7 == (char *)0x0) {
LAB_001abb67:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_1c8);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      lVar6 = 0;
LAB_001abbae:
      do {
        pcVar7 = fgets((char *)&local_338,0x100,__stream);
        if (local_338 < 0x25) {
          if (local_338 == 0x23) goto LAB_001abbe5;
          if (local_338 != 0x24) goto LAB_001abbf1;
LAB_001abbf6:
          puts("Invalid configuration file.");
        }
        else {
          if (local_338 == 0x25) {
LAB_001abbe5:
            if (pcVar7 == (char *)0x0) goto LAB_001abbf6;
            goto LAB_001abbae;
          }
          if (((local_338 == 0x2f) && (pcVar7 != (char *)0x0)) && (local_337 == '/'))
          goto LAB_001abbae;
LAB_001abbf1:
          if (pcVar7 == (char *)0x0) goto LAB_001abbf6;
        }
        iVar5 = __isoc99_sscanf(&local_338,"%d",local_190 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001abc5f;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001abc6b;
          }
          if (local_338 != 0x23) break;
LAB_001abc5f:
          if (pcVar7 == (char *)0x0) goto LAB_001abc70;
        }
        if (local_338 == 0x24) goto LAB_001abc70;
LAB_001abc6b:
        if (pcVar7 == (char *)0x0) {
LAB_001abc70:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%d",local_198 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001abcd9;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001abce5;
          }
          if (local_338 != 0x23) break;
LAB_001abcd9:
          if (pcVar7 == (char *)0x0) goto LAB_001abcea;
        }
        if (local_338 == 0x24) goto LAB_001abcea;
LAB_001abce5:
        if (pcVar7 == (char *)0x0) {
LAB_001abcea:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%d",local_1a0 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001abd53;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001abd5f;
          }
          if (local_338 != 0x23) break;
LAB_001abd53:
          if (pcVar7 == (char *)0x0) goto LAB_001abd64;
        }
        if (local_338 == 0x24) goto LAB_001abd64;
LAB_001abd5f:
        if (pcVar7 == (char *)0x0) {
LAB_001abd64:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%d",local_1a8 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001abdcd;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001abdd9;
          }
          if (local_338 != 0x23) break;
LAB_001abdcd:
          if (pcVar7 == (char *)0x0) goto LAB_001abdde;
        }
        if (local_338 == 0x24) goto LAB_001abdde;
LAB_001abdd9:
        if (pcVar7 == (char *)0x0) {
LAB_001abdde:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%d",local_1b0 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001abe47;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001abe53;
          }
          if (local_338 != 0x23) break;
LAB_001abe47:
          if (pcVar7 == (char *)0x0) goto LAB_001abe58;
        }
        if (local_338 == 0x24) goto LAB_001abe58;
LAB_001abe53:
        if (pcVar7 == (char *)0x0) {
LAB_001abe58:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_1b8 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001abec1;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001abecd;
          }
          if (local_338 != 0x23) break;
LAB_001abec1:
          if (pcVar7 == (char *)0x0) goto LAB_001abed2;
        }
        if (local_338 == 0x24) goto LAB_001abed2;
LAB_001abecd:
        if (pcVar7 == (char *)0x0) {
LAB_001abed2:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%d",pRoboteq->bProportionalPWs + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar6 = 0;
LAB_001abf29:
      do {
        pcVar7 = fgets((char *)&local_338,0x100,__stream);
        if (local_338 < 0x25) {
          if (local_338 == 0x23) goto LAB_001abf60;
          if (local_338 != 0x24) goto LAB_001abf6c;
LAB_001abf71:
          puts("Invalid configuration file.");
        }
        else {
          if (local_338 == 0x25) {
LAB_001abf60:
            if (pcVar7 == (char *)0x0) goto LAB_001abf71;
            goto LAB_001abf29;
          }
          if (((local_338 == 0x2f) && (pcVar7 != (char *)0x0)) && (local_337 == '/'))
          goto LAB_001abf29;
LAB_001abf6c:
          if (pcVar7 == (char *)0x0) goto LAB_001abf71;
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_140 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001abfda;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001abfe6;
          }
          if (local_338 != 0x23) break;
LAB_001abfda:
          if (pcVar7 == (char *)0x0) goto LAB_001abfeb;
        }
        if (local_338 == 0x24) goto LAB_001abfeb;
LAB_001abfe6:
        if (pcVar7 == (char *)0x0) {
LAB_001abfeb:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_148 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001ac054;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001ac060;
          }
          if (local_338 != 0x23) break;
LAB_001ac054:
          if (pcVar7 == (char *)0x0) goto LAB_001ac065;
        }
        if (local_338 == 0x24) goto LAB_001ac065;
LAB_001ac060:
        if (pcVar7 == (char *)0x0) {
LAB_001ac065:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_150 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001ac0ce;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001ac0da;
          }
          if (local_338 != 0x23) break;
LAB_001ac0ce:
          if (pcVar7 == (char *)0x0) goto LAB_001ac0df;
        }
        if (local_338 == 0x24) goto LAB_001ac0df;
LAB_001ac0da:
        if (pcVar7 == (char *)0x0) {
LAB_001ac0df:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_158 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001ac148;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001ac154;
          }
          if (local_338 != 0x23) break;
LAB_001ac148:
          if (pcVar7 == (char *)0x0) goto LAB_001ac159;
        }
        if (local_338 == 0x24) goto LAB_001ac159;
LAB_001ac154:
        if (pcVar7 == (char *)0x0) {
LAB_001ac159:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_160 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001ac1c2;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001ac1ce;
          }
          if (local_338 != 0x23) break;
LAB_001ac1c2:
          if (pcVar7 == (char *)0x0) goto LAB_001ac1d3;
        }
        if (local_338 == 0x24) goto LAB_001ac1d3;
LAB_001ac1ce:
        if (pcVar7 == (char *)0x0) {
LAB_001ac1d3:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_168 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001ac23c;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001ac248;
          }
          if (local_338 != 0x23) break;
LAB_001ac23c:
          if (pcVar7 == (char *)0x0) goto LAB_001ac24d;
        }
        if (local_338 == 0x24) goto LAB_001ac24d;
LAB_001ac248:
        if (pcVar7 == (char *)0x0) {
LAB_001ac24d:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_170 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001ac2b6;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001ac2c2;
          }
          if (local_338 != 0x23) break;
LAB_001ac2b6:
          if (pcVar7 == (char *)0x0) goto LAB_001ac2c7;
        }
        if (local_338 == 0x24) goto LAB_001ac2c7;
LAB_001ac2c2:
        if (pcVar7 == (char *)0x0) {
LAB_001ac2c7:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_178 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001ac330;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001ac33c;
          }
          if (local_338 != 0x23) break;
LAB_001ac330:
          if (pcVar7 == (char *)0x0) goto LAB_001ac341;
        }
        if (local_338 == 0x24) goto LAB_001ac341;
LAB_001ac33c:
        if (pcVar7 == (char *)0x0) {
LAB_001ac341:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_180 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001ac3aa;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001ac3b6;
          }
          if (local_338 != 0x23) break;
LAB_001ac3aa:
          if (pcVar7 == (char *)0x0) goto LAB_001ac3bb;
        }
        if (local_338 == 0x24) goto LAB_001ac3bb;
LAB_001ac3b6:
        if (pcVar7 == (char *)0x0) {
LAB_001ac3bb:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_188 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        while( true ) {
          while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
            if (local_338 == 0x25) goto LAB_001ac424;
            if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
            goto LAB_001ac430;
          }
          if (local_338 != 0x23) break;
LAB_001ac424:
          if (pcVar7 == (char *)0x0) goto LAB_001ac435;
        }
        if (local_338 == 0x24) goto LAB_001ac435;
LAB_001ac430:
        if (pcVar7 == (char *)0x0) {
LAB_001ac435:
          puts("Invalid configuration file.");
        }
        iVar5 = __isoc99_sscanf(&local_338,"%lf",local_1c0 + lVar6);
        if (iVar5 != 1) {
          puts("Invalid configuration file.");
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac4b0;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac4bc;
        }
        if (local_338 != 0x23) break;
LAB_001ac4b0:
        if (pcVar7 == (char *)0x0) goto LAB_001ac4c1;
      }
      if (local_338 == 0x24) goto LAB_001ac4c1;
LAB_001ac4bc:
      if (pcVar7 == (char *)0x0) {
LAB_001ac4c1:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_238);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac535;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac541;
        }
        if (local_338 != 0x23) break;
LAB_001ac535:
        if (pcVar7 == (char *)0x0) goto LAB_001ac546;
      }
      if (local_338 == 0x24) goto LAB_001ac546;
LAB_001ac541:
      if (pcVar7 == (char *)0x0) {
LAB_001ac546:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_230);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac5ba;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac5c6;
        }
        if (local_338 != 0x23) break;
LAB_001ac5ba:
        if (pcVar7 == (char *)0x0) goto LAB_001ac5cb;
      }
      if (local_338 == 0x24) goto LAB_001ac5cb;
LAB_001ac5c6:
      if (pcVar7 == (char *)0x0) {
LAB_001ac5cb:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_228);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac63f;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac64b;
        }
        if (local_338 != 0x23) break;
LAB_001ac63f:
        if (pcVar7 == (char *)0x0) goto LAB_001ac650;
      }
      if (local_338 == 0x24) goto LAB_001ac650;
LAB_001ac64b:
      if (pcVar7 == (char *)0x0) {
LAB_001ac650:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_220);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac6c4;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac6d0;
        }
        if (local_338 != 0x23) break;
LAB_001ac6c4:
        if (pcVar7 == (char *)0x0) goto LAB_001ac6d5;
      }
      if (local_338 == 0x24) goto LAB_001ac6d5;
LAB_001ac6d0:
      if (pcVar7 == (char *)0x0) {
LAB_001ac6d5:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_218);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac749;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac755;
        }
        if (local_338 != 0x23) break;
LAB_001ac749:
        if (pcVar7 == (char *)0x0) goto LAB_001ac75a;
      }
      if (local_338 == 0x24) goto LAB_001ac75a;
LAB_001ac755:
      if (pcVar7 == (char *)0x0) {
LAB_001ac75a:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_210);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac7ce;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac7da;
        }
        if (local_338 != 0x23) break;
LAB_001ac7ce:
        if (pcVar7 == (char *)0x0) goto LAB_001ac7df;
      }
      if (local_338 == 0x24) goto LAB_001ac7df;
LAB_001ac7da:
      if (pcVar7 == (char *)0x0) {
LAB_001ac7df:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_208);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac853;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac85f;
        }
        if (local_338 != 0x23) break;
LAB_001ac853:
        if (pcVar7 == (char *)0x0) goto LAB_001ac864;
      }
      if (local_338 == 0x24) goto LAB_001ac864;
LAB_001ac85f:
      if (pcVar7 == (char *)0x0) {
LAB_001ac864:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_200);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac8d8;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac8e4;
        }
        if (local_338 != 0x23) break;
LAB_001ac8d8:
        if (pcVar7 == (char *)0x0) goto LAB_001ac8e9;
      }
      if (local_338 == 0x24) goto LAB_001ac8e9;
LAB_001ac8e4:
      if (pcVar7 == (char *)0x0) {
LAB_001ac8e9:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_1f8);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar7 = fgets((char *)&local_338,0x100,__stream), 0x24 < local_338) {
          if (local_338 == 0x25) goto LAB_001ac95d;
          if (((local_338 != 0x2f) || (pcVar7 == (char *)0x0)) || (local_337 != '/'))
          goto LAB_001ac969;
        }
        if (local_338 != 0x23) break;
LAB_001ac95d:
        if (pcVar7 == (char *)0x0) goto LAB_001ac96e;
      }
      if (local_338 == 0x24) goto LAB_001ac96e;
LAB_001ac969:
      if (pcVar7 == (char *)0x0) {
LAB_001ac96e:
        puts("Invalid configuration file.");
      }
      iVar5 = __isoc99_sscanf(&local_338,"%d",local_1f0);
      if (iVar5 != 1) {
        puts("Invalid configuration file.");
      }
      iVar5 = fclose(__stream);
      if (iVar5 == 0) goto LAB_001ac9be;
      pcVar7 = "fclose() failed.";
    }
    puts(pcVar7);
  }
LAB_001ac9be:
  if (pRoboteq->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pRoboteq->threadperiod = 100;
  }
  uVar9 = 0;
  do {
    uVar2 = pRoboteq->MinPWs[uVar9];
    if (((uVar2 - 0x9c5 < 0xfffff82f) ||
        (uVar3 = pRoboteq->MidPWs[uVar9], uVar3 - 0x9c5 < 0xfffff82f)) ||
       (uVar4 = pRoboteq->MaxPWs[uVar9], uVar4 - 0x9c5 < 0xfffff82f)) {
LAB_001aca2e:
      printf("Invalid parameters : PWM channel %d.\n",uVar9 & 0xffffffff);
      pRoboteq->MinPWs[uVar9] = 1000;
      pRoboteq->MidPWs[uVar9] = 0x5dc;
      pRoboteq->MaxPWs[uVar9] = 2000;
      pRoboteq->InitPWs[uVar9] = 0x5dc;
      pRoboteq->ThresholdPWs[uVar9] = 0;
      pRoboteq->CoefPWs[uVar9] = 1.0;
      pRoboteq->bProportionalPWs[uVar9] = 1;
    }
    else {
      iVar5 = pRoboteq->InitPWs[uVar9];
      if (iVar5 != 0) {
        if (((uVar3 <= uVar4) && (uVar2 <= uVar3)) &&
           ((iVar5 <= (int)uVar4 && (((int)uVar2 <= iVar5 && (0xfffff82e < iVar5 - 0x9c5U))))))
        goto LAB_001acad3;
        goto LAB_001aca2e;
      }
      if (uVar4 < uVar3 || uVar3 < uVar2) goto LAB_001aca2e;
LAB_001acad3:
      if (pRoboteq->ThresholdPWs[uVar9] < 0) goto LAB_001aca2e;
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 3);
  pRoboteq->LastAIs[4] = 0;
  pRoboteq->LastAIs[5] = 0;
  pRoboteq->LastAIs[6] = 0;
  pRoboteq->LastAIs[7] = 0;
  pRoboteq->LastAIs[1] = 0;
  pRoboteq->LastAIs[2] = 0;
  pRoboteq->LastAIs[3] = 0;
  pRoboteq->LastAIs[4] = 0;
  pRoboteq->LastPWs[0] = 0;
  pRoboteq->LastPWs[1] = 0;
  pRoboteq->LastPWs[2] = 0;
  pRoboteq->LastAIs[0] = 0;
  if (2 < (uint)pRoboteq->rudderchan) {
    puts("Invalid parameter : rudderchan.");
    pRoboteq->rudderchan = 2;
  }
  if (2 < (uint)pRoboteq->rightthrusterchan) {
    puts("Invalid parameter : rightthrusterchan.");
    pRoboteq->rightthrusterchan = 1;
  }
  if (2 < (uint)pRoboteq->leftthrusterchan) {
    puts("Invalid parameter : leftthrusterchan.");
    pRoboteq->leftthrusterchan = 0;
  }
  if (pRoboteq->vbat1analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : vbat1analoginputchan.");
    pRoboteq->vbat1analoginputchan = -1;
  }
  if (pRoboteq->ibat1analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : ibat1analoginputchan.");
    pRoboteq->ibat1analoginputchan = -1;
  }
  if (pRoboteq->vbat2analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : vbat2analoginputchan.");
    pRoboteq->vbat2analoginputchan = -1;
  }
  if (pRoboteq->ibat2analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : ibat2analoginputchan.");
    pRoboteq->ibat2analoginputchan = -1;
  }
  if (pRoboteq->vbat3analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : vbat3analoginputchan.");
    pRoboteq->vbat3analoginputchan = -1;
  }
  if (pRoboteq->ibat3analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : ibat3analoginputchan.");
    pRoboteq->ibat3analoginputchan = -1;
  }
  if (pRoboteq->switchanaloginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : switchanaloginputchan.");
    pRoboteq->switchanaloginputchan = -1;
  }
  iVar5 = OpenRS232Port(&pRoboteq->RS232Port,pRoboteq->szDevPath);
  if (iVar5 != 0) {
    puts("Unable to connect to a Roboteq.");
    return 1;
  }
  iVar5 = (pRoboteq->RS232Port).DevType;
  if (3 < iVar5 - 1U) {
    if ((iVar5 != 0) ||
       (iVar5 = SetOptionsComputerRS232Port
                          ((pRoboteq->RS232Port).hDev,pRoboteq->BaudRate,'\0',0,'\b','\0',
                           pRoboteq->timeout), iVar5 != 0)) {
      pcVar7 = "Unable to connect to a Roboteq.";
      goto LAB_001accfc;
    }
    tcflush(*(int *)&(pRoboteq->RS232Port).hDev,2);
  }
  iVar5 = IssueCommandRoboteq(pRoboteq,"?","FID","",10,local_138,0);
  if (iVar5 == 0) {
    sVar8 = strlen(local_138);
    if (sVar8 < 0xc) {
      puts("Warning : A Roboteq has an unrecognized version.");
    }
    puts("Roboteq connected.");
    return 0;
  }
  pcVar7 = "Unable to connect to a Roboteq : FID failure.";
LAB_001accfc:
  puts(pcVar7);
  CloseRS232Port(&pRoboteq->RS232Port);
  return 1;
}

Assistant:

inline int ConnectRoboteq(ROBOTEQ* pRoboteq, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	int channel = 0;
	char response[256];

	memset(pRoboteq->szCfgFilePath, 0, sizeof(pRoboteq->szCfgFilePath));
	sprintf(pRoboteq->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pRoboteq->szDevPath, 0, sizeof(pRoboteq->szDevPath));
		sprintf(pRoboteq->szDevPath, "COM1");
		pRoboteq->BaudRate = 9600;
		pRoboteq->timeout = 1000;
		pRoboteq->threadperiod = 100;
		pRoboteq->bSaveRawData = 1;
		pRoboteq->bEcho = 1;
		for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
		{
			pRoboteq->MinPWs[channel] = 1000;
			pRoboteq->MidPWs[channel] = 1500;
			pRoboteq->MaxPWs[channel] = 2000;
			pRoboteq->InitPWs[channel] = 1500;
			pRoboteq->ThresholdPWs[channel] = 0;
			pRoboteq->CoefPWs[channel] = 1;
			pRoboteq->bProportionalPWs[channel] = 1;
		}
		for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
		{
			pRoboteq->analoginputoffset[channel] = 0;
			pRoboteq->analoginputthreshold[channel] = 0;
			pRoboteq->analoginputcoef[channel] = 1;
			pRoboteq->analoginputx[channel] = 0;
			pRoboteq->analoginputy[channel] = 0;
			pRoboteq->analoginputz[channel] = 0;
			pRoboteq->analoginputphi[channel] = 0;
			pRoboteq->analoginputtheta[channel] = 0;
			pRoboteq->analoginputpsi[channel] = 0;
			pRoboteq->analoginputmin[channel] = 0;
			pRoboteq->analoginputmax[channel] = 0;
		}
		pRoboteq->rudderchan = 2;
		pRoboteq->rightthrusterchan = 1;
		pRoboteq->leftthrusterchan = 0;
		pRoboteq->vbat1analoginputchan = -1;
		pRoboteq->ibat1analoginputchan = -1;
		pRoboteq->vbat2analoginputchan = -1;
		pRoboteq->ibat2analoginputchan = -1;
		pRoboteq->vbat3analoginputchan = -1;
		pRoboteq->ibat3analoginputchan = -1;
		pRoboteq->switchanaloginputchan = -1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pRoboteq->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->bEcho) != 1) printf("Invalid configuration file.\n");

			for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MinPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MidPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MaxPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->InitPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->ThresholdPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->CoefPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->bProportionalPWs[channel]) != 1) printf("Invalid configuration file.\n");
			}

			for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputoffset[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputthreshold[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputcoef[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputx[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputy[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputz[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputphi[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputtheta[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputpsi[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputmin[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputmax[channel]) != 1) printf("Invalid configuration file.\n");
			}

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->rudderchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->rightthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->leftthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat1analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat1analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat2analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat2analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat3analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat3analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->switchanaloginputchan) != 1) printf("Invalid configuration file.\n");

			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pRoboteq->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pRoboteq->threadperiod = 100;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (
			(pRoboteq->MinPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MinPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MidPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MidPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MaxPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MaxPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)
			||(
			(pRoboteq->InitPWs[channel] != 0)&&
			((pRoboteq->InitPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->InitPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MinPWs[channel] > pRoboteq->InitPWs[channel])||(pRoboteq->InitPWs[channel] > pRoboteq->MaxPWs[channel]))			
			)||
			(pRoboteq->MinPWs[channel] > pRoboteq->MidPWs[channel])||(pRoboteq->MidPWs[channel] > pRoboteq->MaxPWs[channel])||
			(pRoboteq->ThresholdPWs[channel] < 0)
			)
		{
			printf("Invalid parameters : PWM channel %d.\n", channel);
			pRoboteq->MinPWs[channel] = 1000;
			pRoboteq->MidPWs[channel] = 1500;
			pRoboteq->MaxPWs[channel] = 2000;
			pRoboteq->InitPWs[channel] = 1500;
			pRoboteq->ThresholdPWs[channel] = 0;
			pRoboteq->CoefPWs[channel] = 1;
			pRoboteq->bProportionalPWs[channel] = 1;
		}
	}

	// Used to save raw data, should be handled specifically...
	//pRoboteq->pfSaveFile = NULL;

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		pRoboteq->LastPWs[channel] = 0;
	}

	for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
	{
		pRoboteq->LastAIs[channel] = 0;
	}

	if ((pRoboteq->rudderchan < 0)||(pRoboteq->rudderchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : rudderchan.\n");
		pRoboteq->rudderchan = 2;
	}
	if ((pRoboteq->rightthrusterchan < 0)||(pRoboteq->rightthrusterchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : rightthrusterchan.\n");
		pRoboteq->rightthrusterchan = 1;
	}
	if ((pRoboteq->leftthrusterchan < 0)||(pRoboteq->leftthrusterchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : leftthrusterchan.\n");
		pRoboteq->leftthrusterchan = 0;
	}

	if ((pRoboteq->vbat1analoginputchan < -1)||(pRoboteq->vbat1analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat1analoginputchan.\n");
		pRoboteq->vbat1analoginputchan = -1;
	}
	if ((pRoboteq->ibat1analoginputchan < -1)||(pRoboteq->ibat1analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat1analoginputchan.\n");
		pRoboteq->ibat1analoginputchan = -1;
	}
	if ((pRoboteq->vbat2analoginputchan < -1)||(pRoboteq->vbat2analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat2analoginputchan.\n");
		pRoboteq->vbat2analoginputchan = -1;
	}
	if ((pRoboteq->ibat2analoginputchan < -1)||(pRoboteq->ibat2analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat2analoginputchan.\n");
		pRoboteq->ibat2analoginputchan = -1;
	}
	if ((pRoboteq->vbat3analoginputchan < -1)||(pRoboteq->vbat3analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat3analoginputchan.\n");
		pRoboteq->vbat3analoginputchan = -1;
	}
	if ((pRoboteq->ibat3analoginputchan < -1)||(pRoboteq->ibat3analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat3analoginputchan.\n");
		pRoboteq->ibat3analoginputchan = -1;
	}
	if ((pRoboteq->switchanaloginputchan < -1)||(pRoboteq->switchanaloginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : switchanaloginputchan.\n");
		pRoboteq->switchanaloginputchan = -1;
	}

	if (OpenRS232Port(&pRoboteq->RS232Port, pRoboteq->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pRoboteq->RS232Port, pRoboteq->BaudRate, NOPARITY, FALSE, 8,
		ONESTOPBIT, (UINT)pRoboteq->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq.\n");
		CloseRS232Port(&pRoboteq->RS232Port);
		return EXIT_FAILURE;
	}

	if (IssueCommandRoboteq(pRoboteq, "?", "FID", "", 10, response, FALSE) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq : FID failure.\n");
		CloseRS232Port(&pRoboteq->RS232Port);
		return EXIT_FAILURE;
	}
	if (strlen(response) < 12)
	{
		printf("Warning : A Roboteq has an unrecognized version.\n");
	}

	printf("Roboteq connected.\n");

	return EXIT_SUCCESS;
}